

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O2

bool __thiscall DOMTest::testAttr(DOMTest *this,DOMDocument *document)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  DOMNode *pDVar4;
  XMLCh *pXVar5;
  long *plVar6;
  long *plVar7;
  wchar16 *pwVar8;
  wchar16 *pwVar9;
  long lVar10;
  DOMDocument *pDVar11;
  XMLCh *pXVar12;
  XMLCh *pXVar13;
  DOMDocument *pDVar14;
  DOMNode *pDVar15;
  DOMNode *pDVar16;
  long *plVar17;
  long *plVar18;
  bool bVar19;
  bool local_4c;
  
  xercesc_4_0::XMLString::transcode
            ("testAttribute",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar4 = (DOMNode *)(**(code **)(*(long *)document + 0x48))(document,tempStr);
  xercesc_4_0::XMLString::transcode
            ("testAttribute\'s value",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x158))(pDVar4,tempStr);
  pXVar5 = (XMLCh *)(**(code **)(*(long *)document + 0x68))(document);
  plVar6 = (long *)(**(code **)(*(long *)pXVar5 + 0x168))(pXVar5,pDVar4);
  if (plVar6 != (long *)0x0) {
    (**(code **)(*plVar6 + 0x138))(plVar6);
  }
  xercesc_4_0::XMLString::transcode
            ("testAttribute",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)pXVar5 + 0x150))(pXVar5,tempStr);
  xercesc_4_0::XMLString::transcode
            ("dFirstElementdFirstElement",tempStr2,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar7 = (long *)(**(code **)(*(long *)pXVar5 + 0x150))(pXVar5,tempStr2);
  uVar2 = (**(code **)(*plVar7 + 0x100))(plVar7,plVar6);
  myposition = (short)uVar2;
  uVar2 = uVar2 >> 5 & 1;
  local_4c = SUB41(uVar2,0);
  if (uVar2 == 0) {
    fprintf(_stderr,"DOMNode::compareDocumentPosition does not work in line %i\n",0x40a);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x140))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'getName\' method failed to work properly!\n",0x3f,1,_stderr);
    local_4c = false;
  }
  xercesc_4_0::XMLString::transcode
            ("testAttribute\'s value",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'getNodeValue\' method failed to work properly!\n",0x44,1,_stderr
          );
    local_4c = false;
  }
  cVar1 = (**(code **)(*plVar6 + 0x148))(plVar6);
  if (cVar1 == '\0') {
    fwrite("Warning!!! DOMAttr\'s \'getSpecified\' method failed to work properly!\n",0x44,1,_stderr
          );
    local_4c = false;
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x150))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'getValue\' method failed to work properly!\n",0x40,1,_stderr);
    local_4c = false;
  }
  xercesc_4_0::XMLString::transcode
            ("Reset Value",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar6 + 0x98))(plVar6,tempStr);
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'setNodeValue\' method failed to work properly!\n",0x44,1,_stderr
          );
    local_4c = false;
  }
  (**(code **)(*plVar6 + 0x158))(plVar6,&xercesc_4_0::XMLUni::fgZeroLenString);
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x150))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString
                    ((wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'setValue\' to \'0\' method failed to work properly!\n",0x47,1,
           _stderr);
    local_4c = false;
  }
  xercesc_4_0::XMLString::transcode
            ("Another value ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*plVar6 + 0x158))(plVar6,tempStr);
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x150))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    fwrite("Warning!!! DOMAttr\'s \'setValue\' method failed to work properly!",0x3f,1,_stderr);
    local_4c = false;
  }
  plVar7 = (long *)(**(code **)(*plVar6 + 0x68))(plVar6,1);
  pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x10))(plVar7);
  pwVar9 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar9);
  bVar19 = iVar3 == 0;
  lVar10 = (**(code **)(*plVar7 + 0x18))(plVar7);
  if (lVar10 == 0) {
    lVar10 = (**(code **)(*plVar6 + 0x18))(plVar6);
    bVar19 = lVar10 == 0 && bVar19;
  }
  lVar10 = (**(code **)(*plVar7 + 0x18))(plVar7);
  if ((lVar10 != 0) && (lVar10 = (**(code **)(*plVar6 + 0x18))(plVar6), lVar10 == 0)) {
    bVar19 = false;
  }
  lVar10 = (**(code **)(*plVar7 + 0x18))(plVar7);
  if ((lVar10 == 0) || (lVar10 = (**(code **)(*plVar6 + 0x18))(plVar6), lVar10 == 0)) {
LAB_00109d55:
    if (bVar19) goto LAB_00109d5e;
  }
  else {
    pwVar8 = (wchar16 *)(**(code **)(*plVar7 + 0x18))(plVar7);
    pwVar9 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
    iVar3 = xercesc_4_0::XMLString::compareString(pwVar8,pwVar9);
    if (iVar3 == 0) goto LAB_00109d55;
  }
  fwrite("\'cloneNode\' did not clone the Attribute node correctly\n",0x37,1,_stderr);
  local_4c = false;
LAB_00109d5e:
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar11 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar11 != document) {
    local_4c = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x47b);
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,pXVar5,0);
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar5 != pXVar12) {
    local_4c = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x482);
  }
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pXVar13 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar13 != tempStr2) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x48a);
  }
  if (pXVar5 != pXVar12) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x48e);
  }
  if (pXVar5 == pXVar13) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x492);
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar10 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x49a);
  }
  lVar10 = (**(code **)(*(long *)pXVar5 + 0xf0))(pXVar5,tempStr);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x4a0);
  }
  pXVar12 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0,0);
  lVar10 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar12 != tempStr2) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x4a8);
  }
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x4ac);
  }
  pDVar14 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0,0);
  lVar10 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar11 != pDVar14) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x4b3);
  }
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"overwrite userdata with same key in line %i does not work\n",0x4b7);
  }
  lVar10 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x4bd);
  }
  lVar10 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"get non-exist user data in line %i does not work\n",0x4c1);
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar15 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  if (userhandler.currentType != NODE_CLONED) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x4c9)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x4c9);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x4c9);
  }
  if (userhandler.currentSrc != pDVar4) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x4c9);
  }
  if (userhandler.currentDst != pDVar15) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x4c9);
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar16 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x4ce)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x4ce);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x4ce);
  }
  if (userhandler.currentSrc != pDVar4) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x4ce);
  }
  if (userhandler.currentDst != pDVar16) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x4ce);
  }
  (**(code **)(*(long *)pDVar16 + 0xe8))(pDVar16,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar16 + 0x138))(pDVar16);
  if (userhandler.currentType != NODE_DELETED) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x4d3)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x4d3);
  }
  if ((DOMNode *)userhandler.currentData != pDVar4) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x4d3);
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x4d3);
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x4d3);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0x4d7);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pXVar5);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"isSameNode failed in line %i\n",0x4db);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar15);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x4e1);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x4e6);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pXVar5);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"isEqualNode failed in line %i\n",0x4ea);
  }
  xercesc_4_0::XMLString::transcode
            ("http://nsa",tempStr4,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("aa",tempStr5,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("pnsa:aa",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar4 = (DOMNode *)(**(code **)(*(long *)document + 0x48))(document,tempStr5);
  plVar6 = (long *)(**(code **)(*(long *)document + 0x88))(document,tempStr4,tempStr3);
  plVar7 = (long *)(**(code **)(*(long *)document + 0x18))(document,tempStr5);
  (**(code **)(*plVar7 + 0x168))(plVar7,pDVar4);
  (**(code **)(*plVar7 + 0x168))(plVar7,plVar6);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr5,document,&userhandler);
  (**(code **)(*plVar6 + 0xe8))(plVar6,tempStr4,document,0);
  (**(code **)(*(long *)pDVar4 + 0x98))(pDVar4,tempStr5);
  (**(code **)(*plVar6 + 0x98))(plVar6,tempStr4);
  xercesc_4_0::XMLString::transcode
            ("http://nsb",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("bb",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("pnsb:bb",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar17 = (long *)(**(code **)(*(long *)document + 0xf0))(document,plVar6,tempStr,tempStr3);
  pwVar8 = (wchar16 *)(**(code **)(*plVar17 + 0xb0))(plVar17);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x50e);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar17 + 0xc0))(plVar17);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr2,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x513);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar17 + 0x10))(plVar17);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr3,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x518);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr4,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x51e);
  }
  plVar18 = (long *)(**(code **)(*plVar17 + 0x38))(plVar17);
  pwVar8 = (wchar16 *)(**(code **)(*plVar18 + 0x18))(plVar18);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr4,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x523);
  }
  lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7,tempStr,tempStr2);
  if (lVar10 == 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x528);
  }
  lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7,tempStr4,tempStr5);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x52c);
  }
  pDVar11 = (DOMDocument *)(**(code **)(*plVar17 + 0xf0))(plVar17,tempStr4);
  if (pDVar11 != document) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x532);
  }
  cVar1 = (**(code **)(*plVar6 + 0xe0))(plVar6,plVar17);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x537);
  }
  cVar1 = (**(code **)(*plVar6 + 0xd8))(plVar6,plVar17);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x53b);
  }
  plVar6 = (long *)(**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  lVar10 = (**(code **)(*plVar6 + 0xb0))(plVar6);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x545);
  }
  lVar10 = (**(code **)(*plVar6 + 0xc0))(plVar6);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x54a);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x10))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr2,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x54f);
  }
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr5,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x555);
  }
  plVar17 = (long *)(**(code **)(*plVar6 + 0x38))(plVar6);
  pwVar8 = (wchar16 *)(**(code **)(*plVar17 + 0x18))(plVar17);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr5,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x55a);
  }
  lVar10 = (**(code **)(*plVar7 + 0x150))(plVar7,tempStr2);
  if (lVar10 == 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x55f);
  }
  lVar10 = (**(code **)(*plVar7 + 0x150))(plVar7,tempStr5);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x563);
  }
  pDVar11 = (DOMDocument *)(**(code **)(*plVar6 + 0xf0))(plVar6,tempStr5);
  if (pDVar11 != document) {
    local_4c = false;
    fprintf(_stderr,"\'set/getUserData\' in line %i does not work\n",0x569);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,plVar6);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x56e);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,plVar6);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x572);
  }
  pDVar15 = (DOMNode *)(**(code **)(*(long *)document + 0xf0))(document,pDVar4,tempStr,tempStr3);
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pDVar15 + 0xb0))(pDVar15);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x57c);
  }
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pDVar15 + 0xc0))(pDVar15);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr2,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x581);
  }
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pDVar15 + 0x10))(pDVar15);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr3,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x586);
  }
  pwVar8 = (wchar16 *)(**(code **)(*(long *)pDVar15 + 0x18))(pDVar15);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr5,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x58c);
  }
  plVar6 = (long *)(**(code **)(*(long *)pDVar15 + 0x38))(pDVar15);
  pwVar8 = (wchar16 *)(**(code **)(*plVar6 + 0x18))(plVar6);
  iVar3 = xercesc_4_0::XMLString::compareString(tempStr5,pwVar8);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x591);
  }
  lVar10 = (**(code **)(*(long *)pDVar4 + 0x38))(pDVar4);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x596);
  }
  lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7,tempStr,tempStr2);
  if (lVar10 == 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x59b);
  }
  lVar10 = (**(code **)(*plVar7 + 0x198))(plVar7,0,tempStr2);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x59f);
  }
  lVar10 = (**(code **)(*plVar7 + 0x150))(plVar7,tempStr2);
  if (lVar10 != 0) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x5a3);
  }
  pDVar11 = (DOMDocument *)(**(code **)(*(long *)pDVar15 + 0xf0))(pDVar15,tempStr5);
  if (pDVar11 != document) {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x5a9);
  }
  if (userhandler.currentType != NODE_RENAMED) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s operationType does not work in line %i\n",0x5ad)
    ;
  }
  iVar3 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr5);
  if (iVar3 != 0) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s key does not work in line %i\n",0x5ad);
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s data does not work in line %i\n",0x5ad);
  }
  if (userhandler.currentSrc != pDVar4) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s src does not work in line %i\n",0x5ad);
  }
  if (userhandler.currentDst != pDVar15) {
    local_4c = false;
    fprintf(_stderr,"DOMUserDataHandler::handler\'s dst does not work in line %i\n",0x5ad);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar15);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x5b1);
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar15);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"renameNode failed in line %i\n",0x5b5);
  }
  xercesc_4_0::XMLString::transcode
            ("http://nsa",tempStr4,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("aa",tempStr5,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  plVar6 = (long *)(**(code **)(*(long *)document + 0x88))(document,tempStr4,tempStr5);
  (**(code **)(*(long *)testElementNode + 0x168))(testElementNode,plVar6);
  cVar1 = (**(code **)(*plVar6 + 0x168))(plVar6);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"isID failed in line %i\n",0x5c5);
  }
  (**(code **)(*(long *)testElementNode + 0x1d0))(testElementNode,plVar6,1);
  cVar1 = (**(code **)(*plVar6 + 0x168))(plVar6);
  if (cVar1 == '\0') {
    local_4c = false;
    fprintf(_stderr,"isID failed in line %i\n",0x5cc);
  }
  (**(code **)(*(long *)testElementNode + 0x1d0))(testElementNode,plVar6,0);
  cVar1 = (**(code **)(*plVar6 + 0x168))(plVar6);
  if (cVar1 != '\0') {
    local_4c = false;
    fprintf(_stderr,"isID failed in line %i\n",0x5d3);
  }
  (**(code **)(*(long *)testElementNode + 0x170))(testElementNode,plVar6);
  if (local_4c == false) {
    puts("\n*****The DOMAttr* method calls listed above failed, all others worked correctly.*****");
  }
  return local_4c;
}

Assistant:

bool DOMTest::testAttr(DOMDocument* document)
{
    DOMNode* node;
    DOMAttr* attributeNode;
    bool T = true;
    bool OK = true;
// For debugging*****   printf("\n          testAttr's outputs:\n\n");

    XMLString::transcode("testAttribute", tempStr, 3999);
    DOMAttr* testAttribute = document->createAttribute(tempStr);

    XMLString::transcode("testAttribute's value", tempStr, 3999);
    testAttribute->setValue(tempStr);
    node = document->getDocumentElement(); // node gets first element

    // ((DOMElement*)node)->setAttributeNode(testAttribute);
    // attributeNode = ((DOMElement*)node)->getAttributeNode("testAttribute");
    DOMElement* el = (DOMElement*)node;
    DOMNode* rem = el->setAttributeNode(testAttribute);
    if (rem)
        rem->release();

    XMLString::transcode("testAttribute", tempStr, 3999);
    attributeNode = el->getAttributeNode(tempStr);

    //Test compareDocumentPosition, the equivalent case here
    XMLString::transcode("dFirstElementdFirstElement", tempStr2, 3999);
    DOMAttr* docFirstElementAttr = el->getAttributeNode(tempStr2);

    COMPARETREEPOSITIONTEST(docFirstElementAttr, attributeNode, DOMNode::DOCUMENT_POSITION_IMPLEMENTATION_SPECIFIC, __LINE__);

    // Test the name and other data
    if (XMLString::compareString(tempStr, attributeNode->getName()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'getName' method failed to work properly!\n");
        OK = false;
    }

    XMLString::transcode("testAttribute's value", tempStr, 3999);
    if (XMLString::compareString(tempStr, attributeNode->getNodeValue()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'getNodeValue' method failed to work properly!\n");
        OK = false;
    }
    if (! T ==attributeNode->getSpecified())
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'getSpecified' method failed to work properly!\n");
        OK = false;
    }

    if (XMLString::compareString(tempStr, attributeNode->getValue()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'getValue' method failed to work properly!\n");
        OK = false;
    }


    XMLString::transcode("Reset Value", tempStr, 3999);
    attributeNode->setNodeValue(tempStr);   /// LEAK!!!!!
    if (XMLString::compareString(tempStr, attributeNode->getNodeValue()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'setNodeValue' method failed to work properly!\n");
        OK = false;
    }

    attributeNode->setValue(XMLUni::fgZeroLenString);
    if (XMLString::compareString(XMLUni::fgZeroLenString, attributeNode->getValue()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'setValue' to '0' method failed to work properly!\n");
        OK = false;
    }

    XMLString::transcode("Another value ", tempStr, 3999);
    attributeNode->setValue(tempStr);
    if (XMLString::compareString(tempStr, attributeNode->getValue()))
    {
        fprintf(stderr, "Warning!!! DOMAttr's 'setValue' method failed to work properly!");
        OK = false;
    }

    node = attributeNode->cloneNode(T);

    // Check nodes for equality, both their name and value or lack thereof
    bool cloneOK = true;
    if (XMLString::compareString(node->getNodeName(), attributeNode->getNodeName()))
        cloneOK = false;
    if (node->getNodeValue() == 0 &&
        attributeNode->getNodeValue() != 0)
    {
        cloneOK = false;
    }

    if (node->getNodeValue() != 0 && attributeNode->getNodeValue() == 0)
    {
        cloneOK = false;
    }

    if (node->getNodeValue() != 0 && attributeNode->getNodeValue() != 0)
    {
        if (XMLString::compareString(node->getNodeValue(),attributeNode->getNodeValue()))
            cloneOK = false;
    }


/*
    if (! (node->getNodeName(), attributeNode->getNodeName()) &&         // Compares node names for equality
          (node->getNodeValue() != 0 && attributeNode->getNodeValue() != 0)  // Checks to make sure each node has a value node
        ?  node->getNodeValue(), attributeNode->getNodeValue())          // If both have value nodes test those value nodes for equality
        : (node->getNodeValue() == 0 && attributeNode->getNodeValue() == 0)))// If one node doesn't have a value node make sure both don't
*/
    if (cloneOK == false)
        {
            fprintf(stderr, "'cloneNode' did not clone the Attribute node correctly\n");
            OK = false;
        }
        // Deep clone test comparison is in testNode & testDocument

//************************************************* ERROR TESTS
    DOMTest tests;
//!! Throws HIERARCHY_REQUEST_ERR ****************
    //  doc->getDocumentElement()->appendChild(attributeNode);

//!! Throws a NOT_FOUND_ERR ********
    //  attribute2 = doc->createAttribute("testAttribute2");
    //  doc->getDocumentElement()->removeAttributeNode(attribute2);

//!! Throws an INUSE_ATTRIBUTE_ERR ******
    //  DOMElement* element = (DOMElement*)doc->getLastChild()->getLastChild();
    //  element->setAttributeNode(testAttribute );// Tests setNamedItem which generates error through justSetNamedItem.


    // Test the user data
    // Test simple set and get
    DOMAttr* userTest = testAttribute;
    DOMElement*  userFirst = el;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (userFirst->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(userFirst)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test renameNode
    XMLString::transcode("http://nsa", tempStr4, 3999);
    XMLString::transcode("aa", tempStr5, 3999);
    XMLString::transcode("pnsa:aa", tempStr3, 3999);

    // create the attribute
    DOMAttr* renameTestAttribute = document->createAttribute(tempStr5);
    DOMAttr* renameTestAttributeNS = document->createAttributeNS(tempStr4, tempStr3);

    // create the owner element and append the attribute node
    DOMElement* renameTestElement = document->createElement(tempStr5);
    renameTestElement->setAttributeNode(renameTestAttribute);
    renameTestElement->setAttributeNode(renameTestAttributeNS);

    // set up the userdata
    renameTestAttribute->setUserData(tempStr5, (void*) document, &userhandler);
    renameTestAttributeNS->setUserData(tempStr4, (void*) document, 0);

    // set up the node value
    renameTestAttribute->setNodeValue(tempStr5);
    renameTestAttributeNS->setNodeValue(tempStr4);

    XMLString::transcode("http://nsb", tempStr, 3999);
    XMLString::transcode("bb", tempStr2, 3999);
    XMLString::transcode("pnsb:bb", tempStr3, 3999);

    // start the rename tests
    // rename the NS Attribute
    DOMAttr* renameTest = (DOMAttr*) document->renameNode(renameTestAttributeNS, tempStr, tempStr3);
    // test the name
    if (XMLString::compareString(tempStr, renameTest->getNamespaceURI()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr2, renameTest->getLocalName()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr3, renameTest->getNodeName()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the child / nodevalue
    if (XMLString::compareString(tempStr4, renameTest->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr4, renameTest->getFirstChild()->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the owner element
    if (!renameTestElement->getAttributeNodeNS(tempStr, tempStr2)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestElement->getAttributeNodeNS(tempStr4, tempStr5)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test user data
    void* renamedocument = renameTest->getUserData(tempStr4);
    if (document != renamedocument) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test isSame and isEqual
    if (!renameTestAttributeNS->isEqualNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (!renameTestAttributeNS->isSameNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }


    // rename the Attribute (null namespace)
    renameTest = (DOMAttr*) document->renameNode(renameTestAttribute, 0, tempStr2);
    // test the name
    if (renameTest->getNamespaceURI())
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTest->getLocalName())
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr2, renameTest->getNodeName()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the child / nodevalue
    if (XMLString::compareString(tempStr5, renameTest->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr5, renameTest->getFirstChild()->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the owner element
    if (!renameTestElement->getAttributeNode(tempStr2)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestElement->getAttributeNode(tempStr5)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test user data
    renamedocument = renameTest->getUserData(tempStr5);
    if (document != renamedocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }
    // test isSame and isEqual
    if (!renameTestAttribute->isEqualNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (!renameTestAttribute->isSameNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }


    // rename the Attribute (with namespace)
    renameTest = (DOMAttr*) document->renameNode(renameTestAttribute, tempStr, tempStr3);
    // test the name
    if (XMLString::compareString(tempStr, renameTest->getNamespaceURI()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr2, renameTest->getLocalName()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr3, renameTest->getNodeName()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the child / nodevalue
    if (XMLString::compareString(tempStr5, renameTest->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (XMLString::compareString(tempStr5, renameTest->getFirstChild()->getNodeValue()))
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestAttribute->getFirstChild())
    {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test the owner element
    if (!renameTestElement->getAttributeNodeNS(tempStr, tempStr2)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestElement->getAttributeNodeNS(0, tempStr2)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestElement->getAttributeNode(tempStr2)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test user data
    renamedocument = renameTest->getUserData(tempStr5);
    if (document != renamedocument) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    // test userdatahandler
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_RENAMED, tempStr5, document, renameTestAttribute, renameTest, __LINE__);
    // test isSame and isEqual
    // a new node is created here, so both isSame and isEqual are not compared
    if (renameTestAttribute->isEqualNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (renameTestAttribute->isSameNode(renameTest)) {
        fprintf(stderr, "renameNode failed in line %i\n", __LINE__);
        OK = false;
    }



    //isID tests

    XMLString::transcode("http://nsa", tempStr4, 3999);
    XMLString::transcode("aa", tempStr5, 3999);

    DOMAttr *idAtt = document->createAttributeNS(tempStr4, tempStr5);
    testElementNode->setAttributeNode(idAtt);


    if(idAtt->isId()) {
        fprintf(stderr, "isID failed in line %i\n", __LINE__);
        OK = false;
    }

    testElementNode->setIdAttributeNode(idAtt,true);

    if(!idAtt->isId()) {
        fprintf(stderr, "isID failed in line %i\n", __LINE__);
        OK = false;
    }

    testElementNode->setIdAttributeNode(idAtt,false);

    if(idAtt->isId()) {
        fprintf(stderr, "isID failed in line %i\n", __LINE__);
        OK = false;
    }
    //clean up
    testElementNode->removeAttributeNode(idAtt);

    if (! OK)
        printf("\n*****The DOMAttr* method calls listed above failed, all others worked correctly.*****\n");
    return OK;

}